

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_float_&,_const_float_&> * __thiscall
Catch::ExprLhs<float_const&>::operator<=(ExprLhs<const_float_&> *this,float *rhs)

{
  float *in_RDX;
  undefined8 *in_RSI;
  BinaryExpr<const_float_&,_const_float_&> *in_RDI;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar1;
  char *rawChars;
  BinaryExpr<const_float_&,_const_float_&> *this_00;
  StringRef in_stack_ffffffffffffffd8;
  
  uVar1 = *(float *)*in_RSI <= *in_RDX;
  rawChars = (char *)*in_RSI;
  this_00 = in_RDI;
  StringRef::StringRef((StringRef *)in_RDI,rawChars);
  BinaryExpr<const_float_&,_const_float_&>::BinaryExpr
            (this_00,SUB81((ulong)rawChars >> 0x38,0),(float *)in_RDI,in_stack_ffffffffffffffd8,
             (float *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
  return this_00;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }